

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

String testing::internal::FormatForComparisonFailureMessage<std::__cxx11::string,char[20]>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
                 char (*param_2) [20])

{
  size_t extraout_RDX;
  string *in_RDI;
  String SVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000148;
  string *str;
  String *this;
  String local_38 [3];
  
  this = local_38;
  str = in_RDI;
  PrintToString<std::__cxx11::string>(in_stack_00000148);
  String::String(this,str);
  std::__cxx11::string::~string((string *)local_38);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)in_RDI;
  return SVar1;
}

Assistant:

String FormatForComparisonFailureMessage(const T1& value,
                                         const T2& /* other_operand */) {
  // C++Builder compiles this incorrectly if the namespace isn't explicitly
  // given.
  return ::testing::PrintToString(value);
}